

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.hpp
# Opt level: O2

XMLCh * xercesc_4_0::XMLString::replicate(XMLCh *toRep,MemoryManager *manager)

{
  size_t __n;
  XMLSize_t XVar1;
  void *__dest;
  XMLCh *pXVar2;
  
  if (toRep != (XMLCh *)0x0) {
    XVar1 = stringLen(toRep);
    __n = XVar1 * 2 + 2;
    __dest = (void *)(**(code **)(*(long *)manager + 0x18))(manager,__n);
    pXVar2 = (XMLCh *)memcpy(__dest,toRep,__n);
    return pXVar2;
  }
  return (XMLCh *)0x0;
}

Assistant:

inline XMLCh* XMLString::replicate(const XMLCh* const toRep,
                                   MemoryManager* const manager)
{
    // If a null string, return a null string!
    XMLCh* ret = 0;
    if (toRep)
    {
        const XMLSize_t len = stringLen(toRep);
        ret = (XMLCh*) manager->allocate((len+1) * sizeof(XMLCh)); //new XMLCh[len + 1];
        memcpy(ret, toRep, (len + 1) * sizeof(XMLCh));
    }
    return ret;
}